

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

string * __thiscall
perfetto::base::IntToHexString_abi_cxx11_(string *__return_storage_ptr__,base *this,uint32_t number)

{
  size_t sVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ::std::__cxx11::string::resize((ulong)__return_storage_ptr__,'\v');
  sVar1 = SprintfTrunc((__return_storage_ptr__->_M_dataplus)._M_p,0xb,"0x%02x",
                       (ulong)this & 0xffffffff);
  ::std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string IntToHexString(uint32_t number) {
  size_t max_size = 11;  // Max uint32 is 0xFFFFFFFF + 1 for null byte.
  std::string buf;
  buf.resize(max_size);
  size_t final_len = SprintfTrunc(&buf[0], max_size, "0x%02x", number);
  buf.resize(static_cast<size_t>(final_len));  // Cuts off the final null byte.
  return buf;
}